

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

back_insert_iterator<std::vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>,_testing::internal::CastAndAppendTransform<const_google::protobuf::FieldDescriptor_*const_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>_>_>
::
IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>,_3UL>
::operator()(undefined8 param_1,long param_2,
            vector<testing::Matcher<google::protobuf::FieldDescriptor_const*const&>,std::allocator<testing::Matcher<google::protobuf::FieldDescriptor_const*const&>>>
            *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>_>
  bVar1;
  MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> local_30;
  
  PointeeMatcher::operator_cast_to_Matcher
            ((Matcher<const_google::protobuf::FieldDescriptor_*const_&> *)&local_30,
             (PointeeMatcher *)(param_2 + 0x90));
  std::
  vector<testing::Matcher<google::protobuf::FieldDescriptor_const*const&>,std::allocator<testing::Matcher<google::protobuf::FieldDescriptor_const*const&>>>
  ::emplace_back<testing::Matcher<google::protobuf::FieldDescriptor_const*const&>>
            (param_3,(Matcher<const_google::protobuf::FieldDescriptor_*const_&> *)&local_30);
  MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>,_2UL>
          ::operator()((IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>,_testing::internal::PointeeMatcher<testing::PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>_>_>,_2UL>
                        *)&local_30,param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }